

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Instr * __thiscall
GlobOpt::TypeSpecialization
          (GlobOpt *this,Instr *instr,Value **pSrc1Val,Value **pSrc2Val,Value **pDstVal,
          bool *redoTypeSpecRef,bool *forceInvariantHoistingRef)

{
  IRType IVar1;
  OpCode OVar2;
  Value *src1OriginalVal;
  Value *src2OriginalVal;
  Value *pVVar3;
  Opnd *opnd;
  code *pcVar4;
  bool bVar5;
  char cVar6;
  BailOutKind BVar7;
  undefined4 *puVar8;
  FloatConstantValueInfo *pFVar9;
  Value *pVVar10;
  Instr *pIVar11;
  RegOpnd *dst;
  SymOpnd *pSVar12;
  StackSym *varSym;
  Value *pDstVal_00;
  Instr *instr_00;
  GlobOpt *this_00;
  IntConstantBounds local_60;
  bool isInt32;
  IntConstantBounds local_50;
  int32 int32Value;
  GlobOpt *local_40;
  Instr *local_38;
  Instr *instr_local;
  
  *redoTypeSpecRef = false;
  _isInt32 = (Value *)pDstVal;
  local_40 = this;
  local_38 = instr;
  if (*forceInvariantHoistingRef == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1871,"(!*forceInvariantHoistingRef)","!*forceInvariantHoistingRef");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  local_40->field_0xf4 = local_40->field_0xf4 & 0xf3;
  src1OriginalVal = *pSrc1Val;
  src2OriginalVal = *pSrc2Val;
  bVar5 = IR::Instr::ShouldCheckForIntOverflow(instr);
  if (!bVar5) {
    if ((*pSrc1Val != (Value *)0x0) &&
       (bVar5 = ValueInfo::IsFloatConstant((*pSrc1Val)->valueInfo), bVar5)) {
      pFVar9 = ValueInfo::AsFloatConstant((*pSrc1Val)->valueInfo);
      bVar5 = Js::JavascriptNumber::TryGetInt32OrUInt32Value
                        (pFVar9->floatValue,&local_50.lowerBound,(bool *)&local_60);
      if (bVar5) {
        pVVar10 = GetIntConstantValue(local_40,local_50.lowerBound,local_38,(Opnd *)0x0);
        *pSrc1Val = pVVar10;
        if ((char)local_60.lowerBound == '\0') {
          local_40->field_0xf4 = local_40->field_0xf4 | 4;
        }
      }
    }
    if ((*pSrc2Val != (Value *)0x0) &&
       (bVar5 = ValueInfo::IsFloatConstant((*pSrc2Val)->valueInfo), bVar5)) {
      pFVar9 = ValueInfo::AsFloatConstant((*pSrc2Val)->valueInfo);
      bVar5 = Js::JavascriptNumber::TryGetInt32OrUInt32Value
                        (pFVar9->floatValue,&local_50.lowerBound,(bool *)&local_60);
      if (bVar5) {
        pVVar10 = GetIntConstantValue(local_40,local_50.lowerBound,local_38,(Opnd *)0x0);
        *pSrc2Val = pVVar10;
        if ((char)local_60.lowerBound == '\0') {
          local_40->field_0xf4 = local_40->field_0xf4 | 4;
        }
      }
    }
  }
  pVVar10 = *pSrc1Val;
  pVVar3 = *pSrc2Val;
  _int32Value = pSrc2Val;
  if (pVVar10 != (Value *)0x0) {
    if (local_38->m_src2 != (Opnd *)0x0) goto LAB_00427314;
    if ((((((local_40->prePassLoop == (Loop *)0x0) && (local_38->m_kind != InstrKindBranch)) &&
          (bVar5 = ValueInfo::TryGetIntConstantValue(pVVar10->valueInfo,&local_50.lowerBound,false),
          bVar5)) &&
         ((OVar2 = local_38->m_opcode, OVar2 != StElemI_A && (OVar2 != StElemI_A_Strict)))) &&
        (OVar2 != MultiBr)) && ((OVar2 != StElemC && (OVar2 != InlineArrayPop)))) {
      pDstVal = (Value **)_isInt32;
      cVar6 = OptConstFoldUnary(local_40,&local_38,local_50.lowerBound,*pSrc1Val == src1OriginalVal,
                                (Value **)_isInt32);
    }
    else {
      pDstVal = (Value **)src1OriginalVal;
      bVar5 = TypeSpecializeUnary(local_40,&local_38,pSrc1Val,(Value **)_isInt32,src1OriginalVal,
                                  redoTypeSpecRef,forceInvariantHoistingRef);
      if (bVar5) goto LAB_004276ac;
      cVar6 = *redoTypeSpecRef;
    }
    goto joined_r0x00427300;
  }
  if (local_38->m_src2 != (Opnd *)0x0) {
LAB_00427314:
    if ((local_38->m_kind != InstrKindBranch) && (local_40->prePassLoop == (Loop *)0x0)) {
      if ((local_40->field_0xf7 & 2) == 0) {
        local_50.lowerBound = 0;
        local_50.upperBound = 0;
        local_60.lowerBound = 0;
        local_60.upperBound = 0;
        if ((((pVVar10 != (Value *)0x0) &&
             (bVar5 = ValueInfo::TryGetIntConstantBounds(pVVar10->valueInfo,&local_50,false), bVar5)
             ) && (*_int32Value != (Value *)0x0)) &&
           (bVar5 = ValueInfo::TryGetIntConstantBounds((*_int32Value)->valueInfo,&local_60,false),
           bVar5)) {
          pDstVal = (Value **)_isInt32;
          cVar6 = OptConstFoldBinary(local_40,&local_38,&local_50,&local_60,(Value **)_isInt32);
joined_r0x00427300:
          if (cVar6 != '\0') goto LAB_004276ac;
        }
      }
      else if (DAT_01430303 == '\x01') {
        bVar5 = IR::Opnd::IsInt64(local_38->m_src1);
        pDstVal = (Value **)_isInt32;
        if (bVar5) {
          cVar6 = OptConstFoldBinaryWasm<long>
                            (local_40,&local_38,*pSrc1Val,*_int32Value,(Value **)_isInt32);
        }
        else {
          cVar6 = OptConstFoldBinaryWasm<int>
                            (local_40,&local_38,*pSrc1Val,*_int32Value,(Value **)_isInt32);
        }
        goto joined_r0x00427300;
      }
    }
  }
  if ((local_38->m_src2 == (Opnd *)0x0) ||
     (pDstVal = (Value **)_isInt32, pDstVal_00 = src2OriginalVal,
     bVar5 = TypeSpecializeBinary
                       (local_40,&local_38,pSrc1Val,_int32Value,(Value **)_isInt32,src1OriginalVal,
                        src2OriginalVal,redoTypeSpecRef), !bVar5)) {
    if ((*redoTypeSpecRef == false) &&
       (((local_38->m_kind != InstrKindBranch || (local_40->prePassLoop != (Loop *)0x0)) ||
        (bVar5 = OptConstFoldBranch(local_40,local_38,*pSrc1Val,*_int32Value,pDstVal), !bVar5)))) {
      if (local_38->m_src1 != (Opnd *)0x0) {
        local_38 = ToVarUses(local_40,local_38,local_38->m_src1,false,*pSrc1Val);
        if (local_38->m_src2 != (Opnd *)0x0) {
          local_38 = ToVarUses(local_40,local_38,local_38->m_src2,false,*_int32Value);
        }
      }
      opnd = local_38->m_dst;
      if (opnd != (Opnd *)0x0) {
        pIVar11 = ToVarUses(local_40,local_38,opnd,true,(Value *)0x0);
        instr_00 = local_38;
        local_38 = pIVar11;
        bVar5 = OpCodeAttr::IsInlineBuiltIn(pIVar11->m_opcode);
        if ((bVar5) && ((local_40->field_0xf7 & 2) == 0)) {
          TypeSpecializeInlineBuiltInDst(local_40,&local_38,(Value **)_isInt32);
        }
        else {
          bVar5 = IR::Opnd::IsRegOpnd(opnd);
          if (bVar5) {
            dst = IR::Opnd::AsRegOpnd(opnd);
            if ((dst->m_sym->field_0x1a & 1) == 0) {
              ToVarRegOpnd(local_40,dst,local_40->currentBlock);
            }
            else {
              IVar1 = dst->m_sym->m_type;
              if (IVar1 == TyFloat64) {
                ToFloat64Dst(local_40,local_38,dst,local_40->currentBlock);
              }
              else if (IVar1 == TyUint32) {
                if ((local_40->field_0xf7 & 2) != 0) {
                  ToUInt32Dst(local_40,instr_00,dst,local_40->currentBlock);
                }
              }
              else if (IVar1 == TyInt32) {
                ToInt32Dst(local_40,local_38,dst,local_40->currentBlock);
              }
            }
          }
          else {
            bVar5 = IR::Opnd::IsSymOpnd(opnd);
            if ((bVar5) &&
               (pSVar12 = IR::Opnd::AsSymOpnd(opnd), pSVar12->m_sym->m_kind == SymKindStack)) {
              pSVar12 = IR::Opnd::AsSymOpnd(opnd);
              this_00 = (GlobOpt *)pSVar12->m_sym;
              varSym = Sym::AsStackSym((Sym *)this_00);
              ToVarStackSym(this_00,varSym,local_40->currentBlock);
            }
          }
        }
      }
    }
  }
  else if ((((local_40->prePassLoop == (Loop *)0x0) && (local_38->m_opcode != Nop)) &&
           (local_38->m_opcode != Br)) &&
          (((local_38->field_0x38 & 0x10) == 0 ||
           (BVar7 = IR::Instr::GetBailOutKind(local_38),
           (BVar7 & BailOutOnResultConditions) == BailOutInvalid)))) {
    if ((*pSrc1Val == (Value *)0x0) ||
       (bVar5 = ValueInfo::HasIntConstantValue((*pSrc1Val)->valueInfo,false), !bVar5)) {
      if ((*_int32Value != (Value *)0x0) &&
         (bVar5 = ValueInfo::HasIntConstantValue((*_int32Value)->valueInfo,false), bVar5)) {
        OptConstPeep(local_40,local_38,local_38->m_src2,(Value **)pDstVal_00,
                     (*_int32Value)->valueInfo);
      }
    }
    else {
      OptConstPeep(local_40,local_38,local_38->m_src1,(Value **)pDstVal_00,(*pSrc1Val)->valueInfo);
    }
  }
LAB_004276ac:
  if (*_int32Value == pVVar3) {
    *_int32Value = src2OriginalVal;
  }
  if (*pSrc1Val == pVVar10) {
    *pSrc1Val = src1OriginalVal;
  }
  return local_38;
}

Assistant:

IR::Instr *
GlobOpt::TypeSpecialization(
    IR::Instr *instr,
    Value **pSrc1Val,
    Value **pSrc2Val,
    Value **pDstVal,
    bool *redoTypeSpecRef,
    bool *const forceInvariantHoistingRef)
{
    Value *&src1Val = *pSrc1Val;
    Value *&src2Val = *pSrc2Val;
    *redoTypeSpecRef = false;
    Assert(!*forceInvariantHoistingRef);

    this->ignoredIntOverflowForCurrentInstr = false;
    this->ignoredNegativeZeroForCurrentInstr = false;

    // - Int32 values that can't be tagged are created as float constant values instead because a JavascriptNumber var is needed
    //   for that value at runtime. For the purposes of type specialization, recover the int32 values so that they will be
    //   treated as ints.
    // - If int overflow does not matter for the instruction, we can additionally treat uint32 values as int32 values because
    //   the value resulting from the operation will eventually be converted to int32 anyway
    Value *const src1OriginalVal = src1Val;
    Value *const src2OriginalVal = src2Val;

    if(!instr->ShouldCheckForIntOverflow())
    {
        if(src1Val && src1Val->GetValueInfo()->IsFloatConstant())
        {
            int32 int32Value;
            bool isInt32;
            if(Js::JavascriptNumber::TryGetInt32OrUInt32Value(
                    src1Val->GetValueInfo()->AsFloatConstant()->FloatValue(),
                    &int32Value,
                    &isInt32))
            {
                src1Val = GetIntConstantValue(int32Value, instr);
                if(!isInt32)
                {
                    this->ignoredIntOverflowForCurrentInstr = true;
                }
            }
        }
        if(src2Val && src2Val->GetValueInfo()->IsFloatConstant())
        {
            int32 int32Value;
            bool isInt32;
            if(Js::JavascriptNumber::TryGetInt32OrUInt32Value(
                    src2Val->GetValueInfo()->AsFloatConstant()->FloatValue(),
                    &int32Value,
                    &isInt32))
            {
                src2Val = GetIntConstantValue(int32Value, instr);
                if(!isInt32)
                {
                    this->ignoredIntOverflowForCurrentInstr = true;
                }
            }
        }
    }
    const AutoRestoreVal autoRestoreSrc1Val(src1OriginalVal, &src1Val);
    const AutoRestoreVal autoRestoreSrc2Val(src2OriginalVal, &src2Val);

    if (src1Val && instr->GetSrc2() == nullptr)
    {
        // Unary
        // Note make sure that native array StElemI gets to TypeSpecializeStElem. Do this for typed arrays, too?
        int32 intConstantValue;
        if (!this->IsLoopPrePass() &&
            !instr->IsBranchInstr() &&
            src1Val->GetValueInfo()->TryGetIntConstantValue(&intConstantValue) &&
            !(
                // Nothing to fold for element stores. Go into type specialization to see if they can at least be specialized.
                instr->m_opcode == Js::OpCode::StElemI_A ||
                instr->m_opcode == Js::OpCode::StElemI_A_Strict ||
                instr->m_opcode == Js::OpCode::StElemC ||
                instr->m_opcode == Js::OpCode::MultiBr ||
                instr->m_opcode == Js::OpCode::InlineArrayPop
            ))
        {
            if (OptConstFoldUnary(&instr, intConstantValue, src1Val == src1OriginalVal, pDstVal))
            {
                return instr;
            }
        }
        else if (this->TypeSpecializeUnary(
                    &instr,
                    &src1Val,
                    pDstVal,
                    src1OriginalVal,
                    redoTypeSpecRef,
                    forceInvariantHoistingRef))
        {
            return instr;
        }
        else if(*redoTypeSpecRef)
        {
            return instr;
        }
    }
    else if (instr->GetSrc2() && !instr->IsBranchInstr())
    {
        // Binary
        if (!this->IsLoopPrePass())
        {
            if (GetIsAsmJSFunc())
            {
                if (CONFIG_FLAG(WasmFold))
                {
                    bool success = instr->GetSrc1()->IsInt64() ?
                        this->OptConstFoldBinaryWasm<int64>(&instr, src1Val, src2Val, pDstVal) :
                        this->OptConstFoldBinaryWasm<int>(&instr, src1Val, src2Val, pDstVal);

                    if (success)
                    {
                        return instr;
                    }
                }
            }
            else
            {
                // OptConstFoldBinary doesn't do type spec, so only deal with things we are sure are int (IntConstant and IntRange)
                // and not just likely ints  TypeSpecializeBinary will deal with type specializing them and fold them again
                IntConstantBounds src1IntConstantBounds, src2IntConstantBounds;
                if (src1Val && src1Val->GetValueInfo()->TryGetIntConstantBounds(&src1IntConstantBounds))
                {
                    if (src2Val && src2Val->GetValueInfo()->TryGetIntConstantBounds(&src2IntConstantBounds))
                    {
                        if (this->OptConstFoldBinary(&instr, src1IntConstantBounds, src2IntConstantBounds, pDstVal))
                        {
                            return instr;
                        }
                    }
                }
            }
        }
    }
    if (instr->GetSrc2() && this->TypeSpecializeBinary(&instr, pSrc1Val, pSrc2Val, pDstVal, src1OriginalVal, src2OriginalVal, redoTypeSpecRef))
    {
        if (!this->IsLoopPrePass() &&
            instr->m_opcode != Js::OpCode::Nop &&
            instr->m_opcode != Js::OpCode::Br &&    // We may have const fold a branch

            // Cannot const-peep if the result of the operation is required for a bailout check
            !(instr->HasBailOutInfo() && instr->GetBailOutKind() & IR::BailOutOnResultConditions))
        {
            if (src1Val && src1Val->GetValueInfo()->HasIntConstantValue())
            {
                if (this->OptConstPeep(instr, instr->GetSrc1(), pDstVal, src1Val->GetValueInfo()))
                {
                    return instr;
                }
            }
            else if (src2Val && src2Val->GetValueInfo()->HasIntConstantValue())
            {
                if (this->OptConstPeep(instr, instr->GetSrc2(), pDstVal, src2Val->GetValueInfo()))
                {
                    return instr;
                }
            }
        }
        return instr;
    }
    else if(*redoTypeSpecRef)
    {
        return instr;
    }

    if (instr->IsBranchInstr() && !this->IsLoopPrePass())
    {
        if (this->OptConstFoldBranch(instr, src1Val, src2Val, pDstVal))
        {
            return instr;
        }
    }
    // We didn't type specialize, make sure the srcs are unspecialized
    IR::Opnd *src1 = instr->GetSrc1();
    if (src1)
    {
        instr = this->ToVarUses(instr, src1, false, src1Val);

        IR::Opnd *src2 = instr->GetSrc2();
        if (src2)
        {
            instr = this->ToVarUses(instr, src2, false, src2Val);
        }
    }

    IR::Opnd *dst = instr->GetDst();
    if (dst)
    {
        instr = this->ToVarUses(instr, dst, true, nullptr);

        // Handling for instructions other than built-ins that may require only dst type specialization
        // should be added here.
        if(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode) && !GetIsAsmJSFunc()) // don't need to do typespec for asmjs
        {
            this->TypeSpecializeInlineBuiltInDst(&instr, pDstVal);
            return instr;
        }

        // Clear the int specialized bit on the dst.
        if (dst->IsRegOpnd())
        {
            IR::RegOpnd *dstRegOpnd = dst->AsRegOpnd();
            if (!dstRegOpnd->m_sym->IsTypeSpec())
            {
                this->ToVarRegOpnd(dstRegOpnd, this->currentBlock);
            }
            else if (dstRegOpnd->m_sym->IsInt32())
            {
                this->ToInt32Dst(instr, dstRegOpnd, this->currentBlock);
            }
            else if (dstRegOpnd->m_sym->IsUInt32() && GetIsAsmJSFunc())
            {
                this->ToUInt32Dst(instr, dstRegOpnd, this->currentBlock);
            }
            else if (dstRegOpnd->m_sym->IsFloat64())
            {
                this->ToFloat64Dst(instr, dstRegOpnd, this->currentBlock);
            }
        }
        else if (dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsStackSym())
        {
            this->ToVarStackSym(dst->AsSymOpnd()->m_sym->AsStackSym(), this->currentBlock);
        }
    }

    return instr;
}